

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O2

ssize_t __thiscall chatter::Packet::write(Packet *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  uint64_t net;
  uint64_t data_local;
  
  data_local = CONCAT44(in_register_00000034,__fd);
  net = platform::HostToNet64(&data_local);
  append_bytes(this,&net,8);
  return extraout_RAX;
}

Assistant:

void Packet::write(uint64_t data)
{
    uint64_t net = platform::HostToNet64(data);
    append_bytes(&net, sizeof(net));
}